

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::invalid_program_state(NegativeTestContext *ctx)

{
  RenderContext *pRVar1;
  bool bVar2;
  ContextType ctxType;
  mapped_type *pmVar3;
  ProgramSources *pPVar4;
  TestLog *pTVar5;
  TestError *this;
  allocator<char> local_419;
  ProgramPipeline pipeline;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram fragProgram;
  ShaderProgram tessCtrlProgram;
  ShaderProgram tessEvalProgram;
  TessellationEvaluationSource tessEvalSource;
  TessellationControlSource tessCtrlSource;
  FragmentSource frgSource;
  ProgramSources local_f0;
  
  checkTessellationSupport(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragProgram,"GLSL_VERSION_STRING",(allocator<char> *)&tessCtrlProgram);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&fragProgram);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&fragProgram);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragProgram,"GLSL_TESS_EXTENSION_STRING",(allocator<char> *)&tessCtrlProgram
            );
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&fragProgram);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&fragProgram);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tessEvalProgram,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,(allocator<char> *)&local_f0);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&tessCtrlProgram,(string *)&tessEvalProgram)
  ;
  tcu::StringTemplate::specialize((string *)&fragProgram,(StringTemplate *)&tessCtrlProgram,&args);
  glu::FragmentSource::FragmentSource(&frgSource,(string *)&fragProgram);
  std::__cxx11::string::~string((string *)&fragProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&tessCtrlProgram);
  std::__cxx11::string::~string((string *)&tessEvalProgram);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tessEvalProgram,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout (vertices=3) out;\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
             ,(allocator<char> *)&local_f0);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&tessCtrlProgram,(string *)&tessEvalProgram)
  ;
  tcu::StringTemplate::specialize((string *)&fragProgram,(StringTemplate *)&tessCtrlProgram,&args);
  glu::TessellationControlSource::TessellationControlSource(&tessCtrlSource,(string *)&fragProgram);
  std::__cxx11::string::~string((string *)&fragProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&tessCtrlProgram);
  std::__cxx11::string::~string((string *)&tessEvalProgram);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tessEvalProgram,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout(triangles) in;\n\nvoid main()\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position;\n}\n"
             ,(allocator<char> *)&local_f0);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&tessCtrlProgram,(string *)&tessEvalProgram)
  ;
  tcu::StringTemplate::specialize((string *)&fragProgram,(StringTemplate *)&tessCtrlProgram,&args);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            (&tessEvalSource,(string *)&fragProgram);
  std::__cxx11::string::~string((string *)&fragProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&tessCtrlProgram);
  std::__cxx11::string::~string((string *)&tessEvalProgram);
  glu::ProgramPipeline::ProgramPipeline(&pipeline,ctx->m_renderCtx);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&tessCtrlProgram,0,0xac);
  tessCtrlProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  tessCtrlProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  tessCtrlProgram.m_program.m_info.linkOk = false;
  tessCtrlProgram.m_program.m_info._33_7_ = 0;
  tessCtrlProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  pPVar4 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&tessCtrlProgram,&frgSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&fragProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&tessCtrlProgram);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&tessEvalProgram,0,0xac);
  tessEvalProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  tessEvalProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  tessEvalProgram.m_program.m_info.linkOk = false;
  tessEvalProgram.m_program.m_info._33_7_ = 0;
  tessEvalProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  pPVar4 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&tessEvalProgram,&tessCtrlSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&tessCtrlProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&tessEvalProgram);
  pRVar1 = ctx->m_renderCtx;
  memset(&local_f0,0,0xac);
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.separable = true;
  pPVar4 = glu::ProgramSources::operator<<(&local_f0,&tessEvalSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&tessEvalProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources(&local_f0);
  pTVar5 = glu::operator<<((ctx->super_CallLogWrapper).m_log,&fragProgram);
  pTVar5 = glu::operator<<(pTVar5,&tessCtrlProgram);
  glu::operator<<(pTVar5,&tessEvalProgram);
  if (((fragProgram.m_program.m_info.linkOk == true) &&
      (tessCtrlProgram.m_program.m_info.linkOk == true)) &&
     (tessEvalProgram.m_program.m_info.linkOk != false)) {
    glu::CallLogWrapper::glBindProgramPipeline(&ctx->super_CallLogWrapper,pipeline.m_pipeline);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glUseProgramStages
              (&ctx->super_CallLogWrapper,pipeline.m_pipeline,2,fragProgram.m_program.m_program);
    glu::CallLogWrapper::glUseProgramStages
              (&ctx->super_CallLogWrapper,pipeline.m_pipeline,8,tessCtrlProgram.m_program.m_program)
    ;
    glu::CallLogWrapper::glUseProgramStages
              (&ctx->super_CallLogWrapper,pipeline.m_pipeline,0x10,
               tessEvalProgram.m_program.m_program);
    NegativeTestContext::expectError(ctx,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "GL_INVALID_OPERATION is generated if tessellation is active and vertex shader is missing."
               ,&local_419);
    NegativeTestContext::beginSection(ctx,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glBindProgramPipeline(&ctx->super_CallLogWrapper,0);
    NegativeTestContext::expectError(ctx,0);
    glu::ShaderProgram::~ShaderProgram(&tessEvalProgram);
    glu::ShaderProgram::~ShaderProgram(&tessCtrlProgram);
    glu::ShaderProgram::~ShaderProgram(&fragProgram);
    glu::ProgramPipeline::~ProgramPipeline(&pipeline);
    std::__cxx11::string::~string((string *)&tessEvalSource.super_ShaderSource.source);
    std::__cxx11::string::~string((string *)&tessCtrlSource.super_ShaderSource.source);
    std::__cxx11::string::~string((string *)&frgSource.super_ShaderSource.source);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&args._M_t);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"failed to build program",&local_419);
  tcu::TestError::TestError(this,(string *)&local_f0);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void invalid_program_state (NegativeTestContext& ctx)
{
	checkTessellationSupport(ctx);

	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]	= isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";

	glu::FragmentSource frgSource(tcu::StringTemplate(fragmentShaderSource).specialize(args));
	glu::TessellationControlSource tessCtrlSource(tcu::StringTemplate(tessControlShaderSource).specialize(args));
	glu::TessellationEvaluationSource tessEvalSource(tcu::StringTemplate(tessEvalShaderSource).specialize(args));

	glu::ProgramPipeline pipeline(ctx.getRenderContext());

	glu::ShaderProgram	fragProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << frgSource);
	glu::ShaderProgram	tessCtrlProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessCtrlSource);
	glu::ShaderProgram	tessEvalProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessEvalSource);

	tcu::TestLog& log = ctx.getLog();
	log << fragProgram << tessCtrlProgram << tessEvalProgram;

	if (!fragProgram.isOk() || !tessCtrlProgram.isOk() || !tessEvalProgram.isOk())
		throw tcu::TestError("failed to build program");

	ctx.glBindProgramPipeline(pipeline.getPipeline());
	ctx.expectError(GL_NO_ERROR);

	ctx.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, fragProgram.getProgram());
	ctx.glUseProgramStages(pipeline.getPipeline(), GL_TESS_CONTROL_SHADER_BIT, tessCtrlProgram.getProgram());
	ctx.glUseProgramStages(pipeline.getPipeline(), GL_TESS_EVALUATION_SHADER_BIT, tessEvalProgram.getProgram());
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if tessellation is active and vertex shader is missing.");
	ctx.glDrawArrays(GL_PATCHES, 0, 3);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glBindProgramPipeline(0);
	ctx.expectError(GL_NO_ERROR);
}